

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O3

void Handle(Trace *trace,int64_t sno,Args *args)

{
  HandlerFn p_Var1;
  Process *pPVar2;
  runtime_error *this;
  long *plVar3;
  size_type *psVar4;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [6];
  
  if (-1 < sno) {
    if ((0x13f < (ulong)sno) || (p_Var1 = kHandlers[sno], p_Var1 == (HandlerFn)0x0)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_170,sno);
      std::operator+(local_f0,"Unknown syscall ",&local_170);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_f0);
      local_150._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_150._M_dataplus._M_p == psVar4) {
        local_150.field_2._M_allocated_capacity = *psVar4;
        local_150.field_2._8_8_ = plVar3[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar4;
      }
      local_150._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      pPVar2 = Trace::GetTrace(trace,(pid_t)args->PID);
      Trace::GetFileName_abi_cxx11_(&local_110,trace,pPVar2->image_);
      std::operator+(&local_130,&local_150,&local_110);
      std::runtime_error::runtime_error(this,(string *)&local_130);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pPVar2 = Trace::GetTrace(trace,(pid_t)args->PID);
    (*p_Var1)(pPVar2,args);
  }
  return;
}

Assistant:

void Handle(Trace *trace, int64_t sno, const Args &args)
{
  if (sno < 0) {
    return;
  }

  if (sno > sizeof(kHandlers) / sizeof(kHandlers[0]) || !kHandlers[sno]) {
    throw std::runtime_error(
        "Unknown syscall " + std::to_string(sno) + " in " +
        trace->GetFileName(trace->GetTrace(args.PID)->GetImage())
    );
  }

  auto *proc = trace->GetTrace(args.PID);

  try {
    kHandlers[sno](proc, args);
  } catch (std::exception &ex) {
    throw std::runtime_error(
        "Exception while handling syscall " + std::to_string(sno) +
        " in process " + std::to_string(proc->GetUID()) + " (" +
        trace->GetFileName(proc->GetImage()) +
        "): " +
        ex.what()
    );
  }
}